

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSModuleDef * js_module_loader_so(JSContext *ctx,char *module_name)

{
  char *pcVar1;
  long lVar2;
  code *pcVar3;
  JSModuleDef *pJVar4;
  char *in_RSI;
  JSContext *in_RDI;
  char *filename;
  JSInitModuleFunc *init;
  void *hd;
  JSModuleDef *m;
  void *in_stack_ffffffffffffff88;
  JSContext *in_stack_ffffffffffffff90;
  size_t local_68;
  JSContext *in_stack_ffffffffffffffa8;
  char *local_38;
  
  pcVar1 = strchr(in_RSI,0x2f);
  local_38 = in_RSI;
  if (pcVar1 == (char *)0x0) {
    in_stack_ffffffffffffff90 = in_RDI;
    strlen(in_RSI);
    local_38 = (char *)js_malloc(in_stack_ffffffffffffffa8,local_68);
    if (local_38 == (char *)0x0) {
      return (JSModuleDef *)0x0;
    }
    strcpy(local_38,"./");
    strcpy(local_38 + 2,in_RSI);
  }
  lVar2 = dlopen(local_38,2);
  if (local_38 != in_RSI) {
    js_free(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  if (lVar2 == 0) {
    JS_ThrowReferenceError(in_RDI,"could not load module filename \'%s\' as shared library",in_RSI);
  }
  else {
    pcVar3 = (code *)dlsym(lVar2,"js_init_module");
    if (pcVar3 == (code *)0x0) {
      JS_ThrowReferenceError
                (in_RDI,"could not load module filename \'%s\': js_init_module not found",in_RSI);
    }
    else {
      pJVar4 = (JSModuleDef *)(*pcVar3)(in_RDI,in_RSI);
      if (pJVar4 != (JSModuleDef *)0x0) {
        return pJVar4;
      }
      JS_ThrowReferenceError
                (in_RDI,"could not load module filename \'%s\': initialization error",in_RSI);
    }
  }
  if (lVar2 != 0) {
    dlclose(lVar2);
  }
  return (JSModuleDef *)0x0;
}

Assistant:

static JSModuleDef *js_module_loader_so(JSContext *ctx,
                                        const char *module_name)
{
    JSModuleDef *m;
    void *hd;
    JSInitModuleFunc *init;
    char *filename;
    
    if (!strchr(module_name, '/')) {
        /* must add a '/' so that the DLL is not searched in the
           system library paths */
        filename = js_malloc(ctx, strlen(module_name) + 2 + 1);
        if (!filename)
            return NULL;
        strcpy(filename, "./");
        strcpy(filename + 2, module_name);
    } else {
        filename = (char *)module_name;
    }
    
    /* C module */
    hd = dlopen(filename, RTLD_NOW | RTLD_LOCAL);
    if (filename != module_name)
        js_free(ctx, filename);
    if (!hd) {
        JS_ThrowReferenceError(ctx, "could not load module filename '%s' as shared library",
                               module_name);
        goto fail;
    }

    init = dlsym(hd, "js_init_module");
    if (!init) {
        JS_ThrowReferenceError(ctx, "could not load module filename '%s': js_init_module not found",
                               module_name);
        goto fail;
    }

    m = init(ctx, module_name);
    if (!m) {
        JS_ThrowReferenceError(ctx, "could not load module filename '%s': initialization error",
                               module_name);
    fail:
        if (hd)
            dlclose(hd);
        return NULL;
    }
    return m;
}